

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::compute::anon_unknown_0::ImageAtomicOpTestInstance::iterate
          (TestStatus *__return_storage_ptr__,ImageAtomicOpTestInstance *this)

{
  VkDeviceSize bufferSize;
  VkDeviceSize bufferSize_00;
  void *pvVar1;
  ProgramCollection<vk::ProgramBinary> *this_00;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  Allocation *pAVar2;
  deUint32 dVar3;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  DescriptorSetLayoutBuilder *pDVar4;
  DescriptorPoolBuilder *pDVar5;
  DescriptorSetUpdateBuilder *pDVar6;
  ProgramBinary *binary;
  ostream *poVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_598;
  deUint32 local_574;
  Allocator *local_570;
  VkImageMemoryBarrier imagePreCopyBarrier;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_4f8;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined4 local_4c8;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined4 local_4a8;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined4 local_488;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_478;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_458;
  VkDescriptorBufferInfo bufferDescriptorInfo;
  VkDescriptorImageInfo imageDescriptorInfo;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_408;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_3e8;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_3c8;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_3a8;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_388;
  Buffer inputBuffer;
  Buffer outputBuffer;
  Image image;
  Random rnd;
  RefBase<vk::VkCommandBuffer_s_*> local_158;
  VkBufferMemoryBarrier inputBufferPostHostWriteBarrier;
  VkBufferImageCopy copyParams;
  VkBufferMemoryBarrier outputBufferPostCopyBarrier;
  VkImageCreateInfo imageParams;
  
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  queue = Context::getUniversalQueue((this->super_TestInstance).m_context);
  local_574 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  local_570 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_2D;
  imageParams.format = VK_FORMAT_R32_UINT;
  imageParams.extent._0_8_ = *(undefined8 *)(this->m_imageSize).m_data;
  imageParams.extent.depth = 1;
  imageParams.mipLevels = 1;
  imageParams.arrayLayers = 1;
  imageParams.samples = VK_SAMPLE_COUNT_1_BIT;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 9;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.queueFamilyIndexCount = 0;
  imageParams.pQueueFamilyIndices = (deUint32 *)0x0;
  imageParams.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  Image::Image(&image,vk,device,local_570,&imageParams,(MemoryRequirement)0x0);
  local_498 = 1;
  uStack_490 = 1;
  local_488 = 1;
  subresourceRange.levelCount = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&rnd,vk,device,
                (VkImage)image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                         m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R32_UINT,subresourceRange);
  local_388.m_data.object.m_internal._0_4_ = rnd.m_rnd.x;
  local_388.m_data.object.m_internal._4_4_ = rnd.m_rnd.y;
  local_388.m_data.deleter.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&rnd);
  uVar14 = (this->m_imageSize).m_data[0] * (this->m_imageSize).m_data[1] * this->m_localSize;
  bufferSize = (ulong)uVar14 * 4;
  makeBufferCreateInfo((VkBufferCreateInfo *)&rnd,bufferSize,0x20);
  compute::Buffer::Buffer
            (&inputBuffer,vk,device,local_570,(VkBufferCreateInfo *)&rnd,(MemoryRequirement)0x1);
  deRandom_init(&rnd.m_rnd,0x77238ac2);
  pAVar2 = inputBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  pvVar1 = (inputBuffer.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr;
  for (lVar8 = 0; uVar14 != (uint)lVar8; lVar8 = lVar8 + 1) {
    dVar3 = deRandom_getUint32(&rnd.m_rnd);
    *(deUint32 *)((long)pvVar1 + lVar8 * 4) = dVar3;
  }
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,bufferSize);
  uVar15 = (this->m_imageSize).m_data[0] * (this->m_imageSize).m_data[1];
  bufferSize_00 = (ulong)uVar15 * 4;
  makeBufferCreateInfo((VkBufferCreateInfo *)&rnd,bufferSize_00,2);
  compute::Buffer::Buffer
            (&outputBuffer,vk,device,local_570,(VkBufferCreateInfo *)&rnd,(MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder((DescriptorSetLayoutBuilder *)&rnd);
  pDVar4 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     ((DescriptorSetLayoutBuilder *)&rnd,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  pDVar4 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (pDVar4,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&imagePreCopyBarrier,pDVar4,vk,device,0);
  local_458.m_data.deleter.m_device = (VkDevice)imagePreCopyBarrier._16_8_;
  local_458.m_data.deleter.m_allocator = (VkAllocationCallbacks *)imagePreCopyBarrier._24_8_;
  local_458.m_data.object.m_internal = imagePreCopyBarrier._0_8_;
  local_458.m_data.deleter.m_deviceIface = (DeviceInterface *)imagePreCopyBarrier.pNext;
  imagePreCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imagePreCopyBarrier._4_4_ = 0;
  imagePreCopyBarrier.pNext = (void *)0x0;
  imagePreCopyBarrier.srcAccessMask = 0;
  imagePreCopyBarrier.dstAccessMask = 0;
  imagePreCopyBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  imagePreCopyBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&imagePreCopyBarrier);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder((DescriptorSetLayoutBuilder *)&rnd);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&imagePreCopyBarrier);
  pDVar5 = ::vk::DescriptorPoolBuilder::addType
                     ((DescriptorPoolBuilder *)&imagePreCopyBarrier,
                      VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar5 = ::vk::DescriptorPoolBuilder::addType(pDVar5,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&rnd,pDVar5,vk,device,1,1);
  local_3a8.m_data.deleter.m_device = (VkDevice)0x0;
  local_3a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_3a8.m_data.object.m_internal._0_4_ = rnd.m_rnd.x;
  local_3a8.m_data.object.m_internal._4_4_ = rnd.m_rnd.y;
  local_3a8.m_data.deleter.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&rnd);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&imagePreCopyBarrier);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&rnd,vk,device,
                    (VkDescriptorPool)local_3a8.m_data.object.m_internal,
                    (VkDescriptorSetLayout)local_458.m_data.object.m_internal);
  local_4f8.m_data.deleter.m_device = (VkDevice)0x0;
  local_4f8.m_data.deleter.m_pool.m_internal = 0;
  local_4f8.m_data.object.m_internal._0_4_ = rnd.m_rnd.x;
  local_4f8.m_data.object.m_internal._4_4_ = rnd.m_rnd.y;
  local_4f8.m_data.deleter.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&rnd);
  imageDescriptorInfo.sampler.m_internal = 0;
  imageDescriptorInfo.imageView.m_internal = local_388.m_data.object.m_internal;
  imageDescriptorInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
  bufferDescriptorInfo.buffer.m_internal =
       inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  bufferDescriptorInfo.offset = 0;
  bufferDescriptorInfo.range = bufferSize;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder((DescriptorSetUpdateBuilder *)&rnd);
  imagePreCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imagePreCopyBarrier._4_4_ = 0;
  pDVar6 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     ((DescriptorSetUpdateBuilder *)&rnd,
                      (VkDescriptorSet)local_4f8.m_data.object.m_internal,
                      (Location *)&imagePreCopyBarrier,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                      &bufferDescriptorInfo);
  inputBufferPostHostWriteBarrier.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  inputBufferPostHostWriteBarrier._4_4_ = 0;
  pDVar6 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (pDVar6,(VkDescriptorSet)local_4f8.m_data.object.m_internal,
                      (Location *)&inputBufferPostHostWriteBarrier,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                      &imageDescriptorInfo);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar6,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder((DescriptorSetUpdateBuilder *)&rnd);
  this_00 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&imagePreCopyBarrier,"comp",
             (allocator<char> *)&inputBufferPostHostWriteBarrier);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,(string *)&imagePreCopyBarrier);
  ::vk::createShaderModule((Move<vk::Handle<(vk::HandleType)14>_> *)&rnd,vk,device,binary,0);
  local_3c8.m_data.deleter.m_device = (VkDevice)0x0;
  local_3c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_3c8.m_data.object.m_internal._0_4_ = rnd.m_rnd.x;
  local_3c8.m_data.object.m_internal._4_4_ = rnd.m_rnd.y;
  local_3c8.m_data.deleter.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&rnd);
  std::__cxx11::string::~string((string *)&imagePreCopyBarrier);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&rnd,vk,device,
                     (VkDescriptorSetLayout)local_458.m_data.object.m_internal);
  local_478.m_data.deleter.m_device = (VkDevice)0x0;
  local_478.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_478.m_data.object.m_internal._0_4_ = rnd.m_rnd.x;
  local_478.m_data.object.m_internal._4_4_ = rnd.m_rnd.y;
  local_478.m_data.deleter.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&rnd);
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&rnd,vk,device,
                      (VkPipelineLayout)local_478.m_data.object.m_internal,
                      (VkShaderModule)local_3c8.m_data.object.m_internal);
  local_3e8.m_data.deleter.m_device = (VkDevice)0x0;
  local_3e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_3e8.m_data.object.m_internal._0_4_ = rnd.m_rnd.x;
  local_3e8.m_data.object.m_internal._4_4_ = rnd.m_rnd.y;
  local_3e8.m_data.deleter.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&rnd);
  makeBufferMemoryBarrier
            (&inputBufferPostHostWriteBarrier,0x4000,0x20,
             (VkBuffer)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  local_4b8 = 1;
  uStack_4b0 = 1;
  local_4a8 = 1;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)&rnd,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,
             (VkImage)image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_00);
  local_4d8 = 1;
  uStack_4d0 = 1;
  local_4c8 = 1;
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.layerCount = 1;
  makeImageMemoryBarrier
            (&imagePreCopyBarrier,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_01);
  makeBufferMemoryBarrier
            (&outputBufferPostCopyBarrier,0x1000,0x2000,
             (VkBuffer)
             outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize_00);
  makeBufferImageCopy(&copyParams,&this->m_imageSize);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&local_598,vk,device,local_574);
  local_408.m_data.deleter.m_device = local_598.m_data.deleter.m_device;
  local_408.m_data.deleter.m_allocator = local_598.m_data.deleter.m_allocator;
  local_408.m_data.object.m_internal = local_598.m_data.object.m_internal;
  local_408.m_data.deleter.m_deviceIface = local_598.m_data.deleter.m_deviceIface;
  local_598.m_data.object.m_internal = 0;
  local_598.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_598.m_data.deleter.m_device = (VkDevice)0x0;
  local_598.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_598);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&local_158,vk,device,
             (VkCommandPool)local_408.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_598.m_data.deleter.m_device = local_158.m_data.deleter.m_device;
  local_598.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)local_158.m_data.deleter.m_pool.m_internal;
  local_598.m_data.object.m_internal = (deUint64)local_158.m_data.object;
  local_598.m_data.deleter.m_deviceIface = local_158.m_data.deleter.m_deviceIface;
  local_158.m_data.object = (VkCommandBuffer_s *)0x0;
  local_158.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_158.m_data.deleter.m_device = (VkDevice)0x0;
  local_158.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_158);
  beginCommandBuffer(vk,(VkCommandBuffer)local_598.m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_598.m_data.object.m_internal,1,local_3e8.m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,local_598.m_data.object.m_internal,1,local_478.m_data.object.m_internal,0,1,
             &local_4f8,0,0);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_598.m_data.object.m_internal,0x4000,0x800,0,0,0,1,
             (int)&inputBufferPostHostWriteBarrier,1,&rnd);
  (*vk->_vptr_DeviceInterface[0x5d])
            (vk,local_598.m_data.object.m_internal,(ulong)(uint)(this->m_imageSize).m_data[0],
             (ulong)(uint)(this->m_imageSize).m_data[1],1);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_598.m_data.object.m_internal,0x800,0x1000,0,0,0,0,0,1,&imagePreCopyBarrier);
  (*vk->_vptr_DeviceInterface[99])
            (vk,local_598.m_data.object.m_internal,
             image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,6,
             outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,1,&copyParams);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_598.m_data.object.m_internal,0x1000,0x4000,0,0,0,1,
             (int)&outputBufferPostCopyBarrier,0,0);
  endCommandBuffer(vk,(VkCommandBuffer)local_598.m_data.object.m_internal);
  submitCommandsAndWait(vk,device,queue,(VkCommandBuffer)local_598.m_data.object.m_internal);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&local_598);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_408);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_3e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_478);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_3c8);
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((outputBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (outputBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize_00);
  uVar14 = 0;
  uVar10 = 0;
  do {
    if (uVar10 == uVar15) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rnd,"Compute succeeded",(allocator<char> *)&imagePreCopyBarrier);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)&rnd);
      std::__cxx11::string::~string((string *)&rnd);
      goto LAB_006a9f6d;
    }
    uVar9 = (ulong)uVar10;
    iVar11 = 0;
    uVar13 = (ulong)this->m_localSize;
    uVar12 = uVar14;
    while( true ) {
      bVar16 = uVar13 == 0;
      uVar13 = uVar13 - 1;
      if (bVar16) break;
      iVar11 = iVar11 + *(int *)((long)(inputBuffer.m_allocation.
                                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                        .m_data.ptr)->m_hostPtr + (ulong)uVar12 * 4);
      uVar12 = uVar12 + 1;
    }
    uVar10 = uVar10 + 1;
    uVar14 = uVar14 + this->m_localSize;
  } while (*(int *)((long)(outputBuffer.m_allocation.
                           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                           m_data.ptr)->m_hostPtr + uVar9 * 4) == iVar11);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&rnd);
  poVar7 = std::operator<<((ostream *)&rnd,"Comparison failed for pixel ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__cxx11::stringbuf::str();
  tcu::TestStatus::fail(__return_storage_ptr__,(string *)&imagePreCopyBarrier);
  std::__cxx11::string::~string((string *)&imagePreCopyBarrier);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&rnd);
LAB_006a9f6d:
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_4f8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_3a8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_458);
  compute::Buffer::~Buffer(&outputBuffer);
  compute::Buffer::~Buffer(&inputBuffer);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_388);
  Image::~Image(&image);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ImageAtomicOpTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Create an image

	const VkImageCreateInfo imageParams = make2DImageCreateInfo(m_imageSize, VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_STORAGE_BIT);
	const Image image(vk, device, allocator, imageParams, MemoryRequirement::Any);

	const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Unique<VkImageView> imageView(makeImageView(vk, device, *image, VK_IMAGE_VIEW_TYPE_2D, VK_FORMAT_R32_UINT, subresourceRange));

	// Input buffer

	const deUint32 numInputValues = multiplyComponents(m_imageSize) * m_localSize;
	const VkDeviceSize inputBufferSizeBytes = sizeof(deUint32) * numInputValues;

	const Buffer inputBuffer(vk, device, allocator, makeBufferCreateInfo(inputBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Populate the input buffer with test data
	{
		de::Random rnd(0x77238ac2);
		const Allocation& inputBufferAllocation = inputBuffer.getAllocation();
		deUint32* bufferPtr = static_cast<deUint32*>(inputBufferAllocation.getHostPtr());
		for (deUint32 i = 0; i < numInputValues; ++i)
			*bufferPtr++ = rnd.getUint32();

		flushMappedMemoryRange(vk, device, inputBufferAllocation.getMemory(), inputBufferAllocation.getOffset(), inputBufferSizeBytes);
	}

	// Create a buffer to store shader output (copied from image data)

	const deUint32 imageArea = multiplyComponents(m_imageSize);
	const VkDeviceSize outputBufferSizeBytes = sizeof(deUint32) * imageArea;
	const Buffer outputBuffer(vk, device, allocator, makeBufferCreateInfo(outputBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Create descriptor set

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	// Set the bindings

	const VkDescriptorImageInfo imageDescriptorInfo = makeDescriptorImageInfo(DE_NULL, *imageView, VK_IMAGE_LAYOUT_GENERAL);
	const VkDescriptorBufferInfo bufferDescriptorInfo = makeDescriptorBufferInfo(*inputBuffer, 0ull, inputBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &bufferDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &imageDescriptorInfo)
		.update(vk, device);

	// Perform the computation
	{
		const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp"), 0u));
		const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
		const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

		const VkBufferMemoryBarrier inputBufferPostHostWriteBarrier = makeBufferMemoryBarrier(VK_ACCESS_HOST_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT, *inputBuffer, 0ull, inputBufferSizeBytes);

		const VkImageMemoryBarrier imageLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_SHADER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL,
			*image, subresourceRange);

		const VkImageMemoryBarrier imagePreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_GENERAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*image, subresourceRange);

		const VkBufferMemoryBarrier outputBufferPostCopyBarrier = makeBufferMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *outputBuffer, 0ull, outputBufferSizeBytes);

		const VkBufferImageCopy copyParams = makeBufferImageCopy(m_imageSize);

		// Prepare the command buffer

		const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
		const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

		// Start recording commands

		beginCommandBuffer(vk, *cmdBuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &inputBufferPostHostWriteBarrier, 1, &imageLayoutBarrier);
		vk.cmdDispatch(*cmdBuffer, m_imageSize.x(), m_imageSize.y(), 1u);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &imagePreCopyBarrier);
		vk.cmdCopyImageToBuffer(*cmdBuffer, *image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *outputBuffer, 1u, &copyParams);
		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &outputBufferPostCopyBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

		endCommandBuffer(vk, *cmdBuffer);

		// Wait for completion

		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Validate the results

	const Allocation& outputBufferAllocation = outputBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), outputBufferSizeBytes);

	const deUint32* bufferPtr = static_cast<deUint32*>(outputBufferAllocation.getHostPtr());
	const deUint32* refBufferPtr = static_cast<deUint32*>(inputBuffer.getAllocation().getHostPtr());

	for (deUint32 pixelNdx = 0; pixelNdx < imageArea; ++pixelNdx)
	{
		const deUint32	res = bufferPtr[pixelNdx];
		deUint32		ref = 0;

		for (deUint32 offs = 0; offs < m_localSize; ++offs)
			ref += refBufferPtr[pixelNdx * m_localSize + offs];

		if (res != ref)
		{
			std::ostringstream msg;
			msg << "Comparison failed for pixel " << pixelNdx;
			return tcu::TestStatus::fail(msg.str());
		}
	}
	return tcu::TestStatus::pass("Compute succeeded");
}